

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O2

void dumpVarint(DumpState *D,size_t x)

{
  ulong uVar1;
  long lVar2;
  lu_byte buff [10];
  
  buff[9] = (byte)x & 0x7f;
  lVar2 = -9;
  uVar1 = 8;
  while (0x7f < x) {
    x = x >> 7;
    buff[uVar1 & 0xffffffff] = (byte)x | 0x80;
    lVar2 = lVar2 + 1;
    uVar1 = uVar1 - 1;
  }
  dumpBlock(D,buff + -lVar2,lVar2 + 10);
  return;
}

Assistant:

static void dumpVarint (DumpState *D, size_t x) {
  lu_byte buff[DIBS];
  unsigned n = 1;
  buff[DIBS - 1] = x & 0x7f;  /* fill least-significant byte */
  while ((x >>= 7) != 0)  /* fill other bytes in reverse order */
    buff[DIBS - (++n)] = cast_byte((x & 0x7f) | 0x80);
  dumpVector(D, buff + DIBS - n, n);
}